

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O0

void __thiscall helics::LogManager::initializeLogging(LogManager *this,string *identifier)

{
  bool bVar1;
  undefined1 uVar2;
  long in_RDI;
  spdlog_ex *ex;
  spdlog_ex *anon_var_0;
  bool expected;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  level_enum in_stack_fffffffffffffde4;
  logger *in_stack_fffffffffffffde8;
  allocator<char> *in_stack_fffffffffffffe10;
  allocator<char> *__a;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  undefined4 in_stack_fffffffffffffe20;
  color_mode in_stack_fffffffffffffe24;
  memory_order in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  string *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  allocator<char> local_109 [120];
  allocator<char> local_91 [33];
  string local_70;
  allocator<char> local_49 [56];
  undefined1 local_11;
  
  local_11 = 0;
  bVar1 = CLI::std::atomic<bool>::compare_exchange_strong
                    ((atomic<bool> *)in_stack_fffffffffffffe38,(bool *)in_stack_fffffffffffffe30,
                     SUB41((uint)in_stack_fffffffffffffe2c >> 0x18,0),in_stack_fffffffffffffe28);
  if (bVar1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (char *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
               in_stack_fffffffffffffe10);
    spdlog::get((string *)in_stack_fffffffffffffde8);
    CLI::std::shared_ptr<spdlog::logger>::operator=
              ((shared_ptr<spdlog::logger> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               (shared_ptr<spdlog::logger> *)in_stack_fffffffffffffdd8);
    CLI::std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x688e99);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    std::allocator<char>::~allocator(local_49);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x48));
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (char *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                 in_stack_fffffffffffffe10);
      spdlog::stdout_color_mt<spdlog::synchronous_factory>
                ((string *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                 in_stack_fffffffffffffe24);
      in_stack_fffffffffffffe38 = (string *)(in_RDI + 0x48);
      in_stack_fffffffffffffe30 = &local_70;
      CLI::std::shared_ptr<spdlog::logger>::operator=
                ((shared_ptr<spdlog::logger> *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 (shared_ptr<spdlog::logger> *)in_stack_fffffffffffffdd8);
      CLI::std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x688f3c);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      std::allocator<char>::~allocator(local_91);
      CLI::std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x688f60);
      spdlog::logger::flush_on(in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
      CLI::std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x688f7d);
      spdlog::logger::set_level(in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
    }
    uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                            (char *)in_stack_fffffffffffffdd8);
    if ((bool)uVar2) {
      __a = local_109;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (char *)CONCAT17(uVar2,in_stack_fffffffffffffe18),__a);
      spdlog::syslog_logger_mt<spdlog::synchronous_factory>
                (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                 in_stack_fffffffffffffe28,SUB41(in_stack_fffffffffffffe24 >> 0x18,0));
      CLI::std::shared_ptr<spdlog::logger>::operator=
                ((shared_ptr<spdlog::logger> *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 (shared_ptr<spdlog::logger> *)in_stack_fffffffffffffdd8);
      CLI::std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x6891f7);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      std::allocator<char>::~allocator((allocator<char> *)local_109);
    }
    else {
      bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x689270);
      uVar2 = (undefined1)((uint)in_stack_fffffffffffffe2c >> 0x18);
      if (!bVar1) {
        spdlog::file_event_handlers::file_event_handlers
                  ((file_event_handlers *)
                   CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
        spdlog::basic_logger_mt<spdlog::synchronous_factory>
                  (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,(bool)uVar2,
                   (file_event_handlers *)
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        CLI::std::shared_ptr<spdlog::logger>::operator=
                  ((shared_ptr<spdlog::logger> *)
                   CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (shared_ptr<spdlog::logger> *)in_stack_fffffffffffffdd8);
        CLI::std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x6892ea);
        spdlog::file_event_handlers::~file_event_handlers
                  ((file_event_handlers *)
                   CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      }
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x58));
    if (bVar1) {
      CLI::std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x6893f4);
      spdlog::logger::flush_on(in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
      CLI::std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x689411);
      spdlog::logger::set_level(in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
    }
  }
  return;
}

Assistant:

void LogManager::initializeLogging(const std::string& identifier)
{
    bool expected{false};
    if (initialized.compare_exchange_strong(expected, true)) {
        logIdentifier = identifier;
        try {
            consoleLogger = spdlog::get("console");
            if (!consoleLogger) {
                try {
                    consoleLogger = spdlog::stdout_color_mt("console");
                    consoleLogger->flush_on(spdlog::level::info);
                    consoleLogger->set_level(spdlog::level::trace);
                }
                catch (const spdlog::spdlog_ex&) {
                    consoleLogger = spdlog::get("console");
                }
            }
            if (logFile == "syslog") {
#if !defined(WIN32) && !defined(__MINGW32__) && !defined(CYGWIN) && !defined(_WIN32)
                fileLogger = spdlog::syslog_logger_mt("syslog", identifier);
#endif
            } else if (!logFile.empty()) {
                fileLogger = spdlog::basic_logger_mt(identifier, logFile);
            }
            if (fileLogger) {
                fileLogger->flush_on(spdlog::level::info);
                fileLogger->set_level(spdlog::level::trace);
            }
        }
        catch (const spdlog::spdlog_ex& ex) {
            std::cerr << "Log init failed in " << identifier << " : " << ex.what() << std::endl;
        }
    }
}